

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O0

void __thiscall GibbsSamplerFromHDP::countN(GibbsSamplerFromHDP *this)

{
  uint uVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  uint local_94;
  uint local_90;
  int t_3;
  int j_3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_80;
  uint *local_78;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  uint local_64;
  uint local_60;
  int k_1;
  uint v_1;
  uint k;
  uint t_2;
  int i_1;
  int j_2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  uint *local_38;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  uint local_28;
  uint local_24;
  int t_1;
  int j_1;
  uint v;
  uint t;
  int i;
  int j;
  GibbsSamplerFromHDP *this_local;
  
  _i = this;
  fillMatrix<unsigned_int>(&this->_njt,0);
  fillTensor<unsigned_int>(&this->_njtv,0);
  for (t = 0; t < this->_J; t = t + 1) {
    v = 0;
    while( true ) {
      uVar1 = v;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_nj,(long)(int)t);
      if (*pvVar2 <= uVar1) break;
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_tji,(long)(int)t);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar3,(long)(int)v);
      j_1 = *pvVar2;
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_xji,(long)(int)t);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar3,(long)(int)v);
      t_1 = *pvVar2;
      pvVar4 = std::
               vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
               ::operator[](&this->_njtv,(long)(int)t);
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](pvVar4,(ulong)(uint)j_1);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar3,(ulong)(uint)t_1);
      *pvVar2 = *pvVar2 + 1;
      v = v + 1;
    }
  }
  for (local_24 = 0; local_24 < this->_J; local_24 = local_24 + 1) {
    local_28 = 0;
    while( true ) {
      uVar1 = local_28;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_Tj,(long)(int)local_24);
      if (*pvVar2 <= uVar1) break;
      pvVar4 = std::
               vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
               ::operator[](&this->_njtv,(long)(int)local_24);
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](pvVar4,(long)(int)local_28);
      local_30._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar3);
      pvVar4 = std::
               vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
               ::operator[](&this->_njtv,(long)(int)local_24);
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](pvVar4,(long)(int)local_28);
      local_38 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar3);
      uVar1 = std::
              accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                        (local_30,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   )local_38,0);
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_njt,(long)(int)local_24);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar3,(long)(int)local_28);
      *pvVar2 = uVar1;
      local_28 = local_28 + 1;
    }
  }
  local_40._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->_nk);
  _j_2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->_nk);
  i_1 = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
            (local_40,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       )_j_2,&i_1);
  fillMatrix<unsigned_int>(&this->_nkv,0);
  for (t_2 = 0; t_2 < this->_J; t_2 = t_2 + 1) {
    k = 0;
    while( true ) {
      uVar1 = k;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_nj,(long)(int)t_2);
      if (*pvVar2 <= uVar1) break;
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_tji,(long)(int)t_2);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar3,(long)(int)k);
      v_1 = *pvVar2;
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_kjt,(long)(int)t_2);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar3,(ulong)v_1);
      k_1 = *pvVar2;
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_xji,(long)(int)t_2);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar3,(long)(int)k);
      local_60 = *pvVar2;
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_nkv,(ulong)(uint)k_1);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar3,(ulong)local_60);
      *pvVar2 = *pvVar2 + 1;
      k = k + 1;
    }
  }
  for (local_64 = 0; local_64 < this->_K; local_64 = local_64 + 1) {
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->_nkv,(long)(int)local_64);
    local_70._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar3);
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->_nkv,(long)(int)local_64);
    local_78 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar3);
    uVar1 = std::
            accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                      (local_70,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 )local_78,0);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->_nk,(long)(int)local_64);
    *pvVar2 = uVar1;
  }
  local_80._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->_mk);
  _j_3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->_mk);
  t_3 = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
            (local_80,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       )_j_3,&t_3);
  for (local_90 = 0; local_90 < this->_J; local_90 = local_90 + 1) {
    local_94 = 0;
    while( true ) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_Tj,(long)(int)local_90);
      if (*pvVar2 <= local_94) break;
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->_kjt,(long)(int)local_90);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar3,(long)(int)local_94);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_mk,(ulong)*pvVar2);
      *pvVar2 = *pvVar2 + 1;
      local_94 = local_94 + 1;
    }
  }
  return;
}

Assistant:

void GibbsSamplerFromHDP::countN(){//{{{
    // count njt from tji
    fillMatrix(_njt, 0u);
    fillTensor(_njtv, 0u);
    for(int j=0; j<_J; j++){
        for(int i=0; i<_nj[j]; i++){
            unsigned int t = _tji[j][i];
            unsigned int v = _xji[j][i];
            _njtv[j][t][v]++;
        }
    }
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            _njt[j][t] = accumulate(_njtv[j][t].begin(), _njtv[j][t].end(), 0u);
        }
    }
    // delete t & update tji
    // count njt from tji
    fill(_nk.begin(), _nk.end(), 0);
    // count nkv from kjtji & xji
    fillMatrix(_nkv, 0u);
    for(int j=0; j<_J; j++){
        for(int i=0; i<_nj[j]; i++){
            unsigned int t = _tji[j][i];
            unsigned int k = _kjt[j][t];
            unsigned int v = _xji[j][i];
            _nkv[k][v]++;
        }
    }
    for(int k=0; k<_K; k++){
        _nk[k] = accumulate(_nkv[k].begin(), _nkv[k].end(), 0u);
    }
    fill(_mk.begin(), _mk.end(), 0);
    // mk
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            _mk[_kjt[j][t]]++;
        }
    }
}